

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_filter.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::filter_impl
          (filter_impl<std::array<unsigned_char,_16UL>_> *this)

{
  _Rb_tree_header *p_Var1;
  range local_24;
  
  p_Var1 = &(this->m_access_list)._M_t._M_impl.super__Rb_tree_header;
  (this->m_access_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_access_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_access_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_access_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_access_list)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  range::range(&local_24,(array<unsigned_char,_16UL>)ZEXT816(0),0);
  ::std::
  _Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>>
  ::_M_insert_unique<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>
            ((_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>>
              *)this,&local_24);
  return;
}

Assistant:

filter_impl<Addr>::filter_impl()
	{
		// make the entire ip-range non-blocked
		m_access_list.insert(range(zero<Addr>(), 0));
	}